

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O0

CURLcode Curl_input_digest(Curl_easy *data,_Bool proxy,char *header)

{
  int iVar1;
  CURLcode CVar2;
  bool bVar3;
  digestdata *local_30;
  digestdata *digest;
  char *header_local;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  if (proxy) {
    local_30 = &(data->state).proxydigest;
  }
  else {
    local_30 = &(data->state).digest;
  }
  iVar1 = curl_strnequal("Digest",header,6);
  if ((iVar1 != 0) && (iVar1 = Curl_isspace((uint)(byte)header[6]), iVar1 != 0)) {
    digest = (digestdata *)(header + 6);
    while( true ) {
      bVar3 = false;
      if (*(char *)&digest->nonce != '\0') {
        iVar1 = Curl_isspace((uint)*(byte *)&digest->nonce);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      digest = (digestdata *)((long)&digest->nonce + 1);
    }
    CVar2 = Curl_auth_decode_digest_http_message((char *)digest,local_30);
    return CVar2;
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_input_digest(struct Curl_easy *data,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header) || !ISSPACE(header[6]))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISSPACE(*header))
    header++;

  return Curl_auth_decode_digest_http_message(header, digest);
}